

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

unique_pointer<const_void> __thiscall
pstore::database::get_spanningu(database *this,address addr,size_t size,bool initialized)

{
  long lVar1;
  long lVar2;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> __dest;
  ulong uVar3;
  undefined7 in_register_00000009;
  int line;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  _Head_base<0UL,_const_void_*,_false> _Var4;
  uint uVar5;
  ulong uVar6;
  void *pvVar7;
  void *__src;
  int in_R8D;
  ulong uVar8;
  ulong uVar9;
  unique_pointer<const_void> uVar10;
  char *local_40;
  
  uVar9 = CONCAT71(in_register_00000009,initialized);
  __dest._M_head_impl = (array<pstore::sat_entry,_65536UL> *)operator_new__(uVar9);
  _Var4._M_head_impl = extraout_RDX;
  if (in_R8D == 0) {
LAB_0011d746:
    this->_vptr_database = (_func_int **)deleter<void_const>;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         __dest._M_head_impl;
    uVar10._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
    super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
    super__Head_base<0UL,_const_void_*,_false>._M_head_impl = _Var4._M_head_impl;
    uVar10._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
    super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
    super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
    super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(const_void_*),_false>)
         (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
    return (unique_pointer<const_void>)
           uVar10._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
           super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
  }
  uVar6 = size >> 0x16;
  lVar1 = *(long *)(addr.a_ + 8);
  uVar3 = (ulong)(((uint)uVar6 & 0xffff) << 5);
  uVar8 = *(ulong *)(lVar1 + uVar3);
  line = 0x140;
  local_40 = 
  "segment_pointer.value != nullptr && segment_pointer.region != nullptr && segment_pointer.is_valid ()"
  ;
  if (((uVar8 != 0) && (lVar2 = *(long *)(uVar3 + lVar1 + 0x10), lVar2 != 0)) &&
     (uVar3 = *(ulong *)(lVar2 + 8), uVar3 <= uVar8)) {
    pvVar7 = (void *)(*(long *)(lVar2 + 0x28) + uVar3);
    if ((void *)(uVar8 + 0x400000) <= pvVar7) {
      __src = (void *)(uVar8 + ((uint)size & 0x3fffff));
      if (__src <= pvVar7) {
        uVar8 = (uVar3 - (long)__src) + *(long *)(lVar2 + 0x28);
        if (uVar9 <= uVar8) {
          uVar8 = uVar9;
        }
        memcpy(__dest._M_head_impl,__src,uVar8);
        uVar9 = uVar9 - uVar8;
        _Var4._M_head_impl = extraout_RDX_00;
        if (uVar9 != 0) {
          pvVar7 = (void *)((long)(__dest._M_head_impl)->_M_elems + uVar8);
          local_40 = "inc < std::numeric_limits<address::segment_type>::max ()";
          do {
            uVar8 = uVar8 + 0x3fffff >> 0x16;
            if (0xfffe < uVar8) {
              line = 0x15c;
              goto LAB_0011d791;
            }
            if (0xffff < (uVar6 & 0xffff) + uVar8) {
              line = 0x15d;
              local_40 = "segment + inc < sat_elements";
              goto LAB_0011d791;
            }
            uVar5 = (int)uVar6 + (int)uVar8;
            uVar6 = (ulong)uVar5;
            lVar2 = *(long *)(lVar1 + 0x10 + (ulong)((uVar5 & 0xffff) << 5));
            if (lVar2 == 0) {
              line = 0x161;
              local_40 = "region != nullptr";
              goto LAB_0011d791;
            }
            uVar8 = *(ulong *)(lVar2 + 0x28);
            if (uVar9 <= *(ulong *)(lVar2 + 0x28)) {
              uVar8 = uVar9;
            }
            memcpy(pvVar7,*(void **)(lVar2 + 8),uVar8);
            pvVar7 = (void *)((long)pvVar7 + uVar8);
            uVar9 = uVar9 - uVar8;
            _Var4._M_head_impl = extraout_RDX_01;
          } while (uVar9 != 0);
        }
        goto LAB_0011d746;
      }
      line = 0x148;
      local_40 = 
      "in_store_ptr >= region_base && in_store_ptr <= region_base + segment_pointer.region->size ()"
      ;
    }
  }
LAB_0011d791:
  assert_failed(local_40,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,line);
}

Assistant:

auto database::get_spanningu (address const addr, std::size_t const size,
                                  bool const initialized) const -> unique_pointer<void const> {
        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        unique_pointer<std::uint8_t> result{new std::uint8_t[size], deleter};
        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return {result.release (), deleter};
    }